

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O2

void __thiscall duckdb::LogicalGet::ResolveTypes(LogicalGet *this)

{
  vector<duckdb::LogicalType,_true> *this_00;
  size_type *psVar1;
  pointer pCVar2;
  size_type *psVar3;
  size_type __n;
  reference index_00;
  LogicalType *pLVar4;
  reference this_01;
  pointer pLVar5;
  reference __x;
  InternalException *this_02;
  iterator __begin2;
  size_type *psVar6;
  size_type *psVar7;
  ColumnIndex *index;
  pointer index_01;
  allocator local_51;
  string local_50;
  
  if ((this->column_ids).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->column_ids).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50._M_dataplus._M_p = (pointer)GetAnyColumn(this);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
    emplace_back<unsigned_long>
              (&(this->column_ids).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
               (unsigned_long *)&local_50);
  }
  this_00 = &(this->super_LogicalOperator).types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
            (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  psVar6 = (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar6 == psVar1) {
    pCVar2 = (this->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (index_01 = (this->column_ids).
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start; index_01 != pCVar2;
        index_01 = index_01 + 1) {
      pLVar4 = GetColumnType(this,index_01);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 pLVar4);
    }
  }
  else {
    for (; psVar6 != psVar1; psVar6 = psVar6 + 1) {
      index_00 = vector<duckdb::ColumnIndex,_true>::get<true>(&this->column_ids,*psVar6);
      pLVar4 = GetColumnType(this,index_00);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 pLVar4);
    }
  }
  psVar7 = (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar7 != psVar3) {
    if ((long)(this->super_LogicalOperator).children.
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_LogicalOperator).children.
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "LogicalGet::project_input can only be set for table-in-out functions",&local_51);
      InternalException::InternalException(this_02,&local_50);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    for (; psVar7 != psVar3; psVar7 = psVar7 + 1) {
      __n = *psVar7;
      this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&(this->super_LogicalOperator).children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this_01);
      __x = vector<duckdb::LogicalType,_true>::get<true>(&pLVar5->types,__n);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 __x);
    }
  }
  return;
}

Assistant:

void LogicalGet::ResolveTypes() {
	if (column_ids.empty()) {
		// no projection - we need to push a column
		column_ids.emplace_back(GetAnyColumn());
	}
	types.clear();
	if (projection_ids.empty()) {
		for (auto &index : column_ids) {
			types.push_back(GetColumnType(index));
		}
	} else {
		for (auto &proj_index : projection_ids) {
			auto &index = column_ids[proj_index];
			types.push_back(GetColumnType(index));
		}
	}
	if (!projected_input.empty()) {
		if (children.size() != 1) {
			throw InternalException("LogicalGet::project_input can only be set for table-in-out functions");
		}
		for (auto entry : projected_input) {
			D_ASSERT(entry < children[0]->types.size());
			types.push_back(children[0]->types[entry]);
		}
	}
}